

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

option_set * nonius::detail::command_line_options(void)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  initializer_list<nonius::detail::option> __l;
  allocator_type local_fa9;
  undefined1 *local_fa8;
  undefined8 local_fa0;
  undefined1 local_f98;
  undefined7 uStack_f97;
  undefined8 uStack_f90;
  undefined1 *local_f88;
  undefined8 local_f80;
  undefined1 local_f78;
  undefined7 uStack_f77;
  undefined8 uStack_f70;
  undefined1 *local_f68;
  undefined8 local_f60;
  undefined1 local_f58;
  undefined7 uStack_f57;
  undefined8 uStack_f50;
  undefined1 *local_f48;
  undefined8 local_f40;
  undefined1 local_f38;
  undefined7 uStack_f37;
  undefined8 uStack_f30;
  undefined1 *local_f28;
  undefined8 local_f20;
  undefined1 local_f18;
  undefined7 uStack_f17;
  undefined8 uStack_f10;
  undefined1 *local_f08;
  undefined8 local_f00;
  undefined1 local_ef8;
  undefined7 uStack_ef7;
  undefined8 uStack_ef0;
  undefined1 *local_ee8;
  undefined8 local_ee0;
  undefined1 local_ed8;
  undefined7 uStack_ed7;
  undefined8 uStack_ed0;
  undefined1 *local_ec8;
  undefined8 local_ec0;
  undefined1 local_eb8;
  undefined7 uStack_eb7;
  undefined8 uStack_eb0;
  undefined1 *local_ea8;
  undefined8 local_ea0;
  undefined1 local_e98;
  undefined7 uStack_e97;
  undefined8 uStack_e90;
  undefined1 *local_e88;
  undefined8 local_e80;
  undefined1 local_e78;
  undefined7 uStack_e77;
  undefined8 uStack_e70;
  undefined1 *local_e68;
  undefined8 local_e60;
  undefined1 local_e58;
  undefined7 uStack_e57;
  undefined8 uStack_e50;
  undefined1 *local_e48;
  undefined8 local_e40;
  undefined1 local_e38;
  undefined7 uStack_e37;
  undefined8 uStack_e30;
  uint *local_e28;
  undefined8 local_e20;
  uint local_e18;
  undefined4 uStack_e14;
  undefined4 uStack_e10;
  undefined4 uStack_e0c;
  uint *local_e08;
  undefined8 local_e00;
  uint local_df8;
  undefined4 uStack_df4;
  undefined4 uStack_df0;
  undefined4 uStack_dec;
  uint *local_de8;
  undefined8 local_de0;
  uint local_dd8;
  undefined4 uStack_dd4;
  undefined4 uStack_dd0;
  undefined4 uStack_dcc;
  uint *local_dc8;
  undefined8 local_dc0;
  uint local_db8;
  undefined4 uStack_db4;
  undefined4 uStack_db0;
  undefined4 uStack_dac;
  undefined1 *local_da8;
  undefined8 local_da0;
  undefined1 local_d98;
  undefined7 uStack_d97;
  undefined8 uStack_d90;
  undefined1 *local_d88;
  undefined8 local_d80;
  undefined1 local_d78;
  undefined7 uStack_d77;
  undefined8 uStack_d70;
  undefined1 *local_d68;
  undefined8 local_d60;
  undefined1 local_d58;
  undefined7 uStack_d57;
  undefined8 uStack_d50;
  uint *local_d48;
  undefined8 local_d40;
  uint local_d38;
  undefined4 uStack_d34;
  undefined4 uStack_d30;
  undefined4 uStack_d2c;
  uint *local_d28;
  undefined8 local_d20;
  uint local_d18;
  undefined4 uStack_d14;
  undefined4 uStack_d10;
  undefined4 uStack_d0c;
  uint *local_d08;
  undefined8 local_d00;
  uint local_cf8;
  undefined4 uStack_cf4;
  undefined4 uStack_cf0;
  undefined4 uStack_cec;
  uint *local_ce8;
  undefined8 local_ce0;
  uint local_cd8;
  undefined4 uStack_cd4;
  undefined4 uStack_cd0;
  undefined4 uStack_ccc;
  uint *local_cc8;
  undefined8 local_cc0;
  uint local_cb8;
  undefined4 uStack_cb4;
  undefined4 uStack_cb0;
  undefined4 uStack_cac;
  uint *local_ca8;
  undefined8 local_ca0;
  uint local_c98;
  undefined4 uStack_c94;
  undefined4 uStack_c90;
  undefined4 uStack_c8c;
  uint *local_c88;
  undefined8 local_c80;
  uint local_c78;
  undefined4 uStack_c74;
  undefined4 uStack_c70;
  undefined4 uStack_c6c;
  uint *local_c68;
  undefined8 local_c60;
  uint local_c58;
  undefined4 uStack_c54;
  undefined4 uStack_c50;
  undefined4 uStack_c4c;
  uint *local_c48;
  undefined8 local_c40;
  uint local_c38;
  undefined4 uStack_c34;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  uint *local_c28;
  undefined8 local_c20;
  uint local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  uint *local_c08;
  undefined8 local_c00;
  uint local_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  uint *local_be8;
  undefined8 local_be0;
  uint local_bd8;
  undefined4 uStack_bd4;
  undefined4 uStack_bd0;
  undefined4 uStack_bcc;
  uint *local_bc8;
  undefined8 local_bc0;
  uint local_bb8;
  undefined4 uStack_bb4;
  undefined4 uStack_bb0;
  undefined4 uStack_bac;
  uint *local_ba8;
  undefined8 local_ba0;
  uint local_b98;
  undefined4 uStack_b94;
  undefined4 uStack_b90;
  undefined4 uStack_b8c;
  uint *local_b88;
  undefined8 local_b80;
  uint local_b78;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  uint *local_b68;
  undefined8 local_b60;
  uint local_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  uint *local_b48;
  undefined8 local_b40;
  uint local_b38;
  undefined4 uStack_b34;
  undefined4 uStack_b30;
  undefined4 uStack_b2c;
  uint *local_b28;
  undefined8 local_b20;
  uint local_b18;
  undefined4 uStack_b14;
  undefined4 uStack_b10;
  undefined4 uStack_b0c;
  uint *local_b08;
  undefined8 local_b00;
  uint local_af8;
  undefined4 uStack_af4;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  uint *local_ae8;
  undefined8 local_ae0;
  uint local_ad8;
  undefined4 uStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  uint *local_ac8;
  undefined8 local_ac0;
  uint local_ab8;
  undefined4 uStack_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  uint *local_aa8;
  undefined8 local_aa0;
  uint local_a98;
  undefined4 uStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  uint *local_a88;
  undefined8 local_a80;
  uint local_a78;
  undefined4 uStack_a74;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  uint *local_a68;
  undefined8 local_a60;
  uint local_a58;
  undefined4 uStack_a54;
  undefined4 uStack_a50;
  undefined4 uStack_a4c;
  uint *local_a48;
  undefined8 local_a40;
  uint local_a38;
  undefined4 uStack_a34;
  undefined4 uStack_a30;
  undefined4 uStack_a2c;
  uint *local_a28;
  undefined8 local_a20;
  uint local_a18;
  undefined4 uStack_a14;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  uint *local_a08;
  undefined8 local_a00;
  uint local_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  uint *local_9e8;
  undefined8 local_9e0;
  uint local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9c8;
  size_type local_9c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9a8;
  size_type local_9a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_988;
  size_type local_980;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_978;
  undefined1 *local_968;
  undefined8 local_960;
  undefined1 local_958;
  undefined7 uStack_957;
  undefined8 uStack_950;
  undefined1 *local_948;
  undefined8 local_940;
  undefined1 local_938;
  undefined7 uStack_937;
  undefined8 uStack_930;
  undefined1 *local_928;
  undefined8 local_920;
  undefined1 local_918;
  undefined7 uStack_917;
  undefined8 uStack_910;
  uint *local_908;
  undefined8 local_900;
  uint local_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  uint *local_8e8;
  undefined8 local_8e0;
  uint local_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  uint *local_8c8;
  undefined8 local_8c0;
  uint local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  uint *local_8a8;
  undefined8 local_8a0;
  uint local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  uint *local_888;
  undefined8 local_880;
  uint local_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  uint *local_868;
  undefined8 local_860;
  uint local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined1 *local_848;
  undefined8 local_840;
  undefined1 local_838;
  uint7 uStack_837;
  undefined8 uStack_830;
  option local_828;
  uint *local_7a0;
  undefined8 local_798;
  uint local_790 [2];
  undefined4 uStack_788;
  undefined4 uStack_784;
  uint *local_780;
  undefined8 local_778;
  uint local_770 [2];
  undefined4 uStack_768;
  undefined4 uStack_764;
  uint *local_760;
  undefined8 local_758;
  uint local_750 [2];
  undefined4 uStack_748;
  undefined4 uStack_744;
  uint *local_740;
  undefined8 local_738;
  uint local_730 [2];
  undefined4 uStack_728;
  undefined4 uStack_724;
  undefined1 local_720;
  uint *local_718;
  undefined8 local_710;
  uint local_708 [2];
  undefined4 uStack_700;
  undefined4 uStack_6fc;
  uint *local_6f8;
  undefined8 local_6f0;
  uint local_6e8 [2];
  undefined4 uStack_6e0;
  undefined4 uStack_6dc;
  uint *local_6d8;
  undefined8 local_6d0;
  uint local_6c8 [2];
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  uint *local_6b8;
  undefined8 local_6b0;
  uint local_6a8 [2];
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined1 local_698;
  uint *local_690;
  undefined8 local_688;
  uint local_680 [2];
  undefined4 uStack_678;
  undefined4 uStack_674;
  uint *local_670;
  undefined8 local_668;
  uint local_660 [2];
  undefined4 uStack_658;
  undefined4 uStack_654;
  uint *local_650;
  undefined8 local_648;
  uint local_640 [2];
  undefined4 uStack_638;
  undefined4 uStack_634;
  uint *local_630;
  undefined8 local_628;
  uint local_620 [2];
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined1 local_610;
  uint *local_608;
  undefined8 local_600;
  uint local_5f8 [2];
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  uint *local_5e8;
  undefined8 local_5e0;
  uint local_5d8 [2];
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  uint *local_5c8;
  undefined8 local_5c0;
  uint local_5b8 [2];
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  uint *local_5a8;
  undefined8 local_5a0;
  uint local_598 [2];
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined1 local_588;
  uint *local_580;
  undefined8 local_578;
  uint local_570 [2];
  undefined4 uStack_568;
  undefined4 uStack_564;
  uint *local_560;
  undefined8 local_558;
  uint local_550 [2];
  undefined4 uStack_548;
  undefined4 uStack_544;
  uint *local_540;
  undefined8 local_538;
  uint local_530 [2];
  undefined4 uStack_528;
  undefined4 uStack_524;
  uint *local_520;
  undefined8 local_518;
  uint local_510 [2];
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500;
  uint *local_4f8;
  undefined8 local_4f0;
  uint local_4e8 [2];
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  uint *local_4d8;
  undefined8 local_4d0;
  uint local_4c8 [2];
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  uint *local_4b8;
  undefined8 local_4b0;
  uint local_4a8 [2];
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  uint *local_498;
  undefined8 local_490;
  uint local_488 [2];
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined1 local_478;
  uint *local_470;
  undefined8 local_468;
  uint local_460 [2];
  undefined4 uStack_458;
  undefined4 uStack_454;
  uint *local_450;
  undefined8 local_448;
  uint local_440 [2];
  undefined4 uStack_438;
  undefined4 uStack_434;
  uint *local_430;
  undefined8 local_428;
  uint local_420 [2];
  undefined4 uStack_418;
  undefined4 uStack_414;
  uint *local_410;
  undefined8 local_408;
  uint local_400 [2];
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined1 local_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8 [8];
  undefined8 uStack_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined1 local_398 [8];
  undefined8 uStack_390;
  uint *local_388;
  undefined8 local_380;
  uint local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined1 local_368;
  uint *local_360;
  undefined8 local_358;
  uint local_350 [2];
  undefined4 uStack_348;
  undefined4 uStack_344;
  uint *local_340;
  undefined8 local_338;
  uint local_330 [2];
  undefined4 uStack_328;
  undefined4 uStack_324;
  uint *local_320;
  undefined8 local_318;
  uint local_310 [2];
  undefined4 uStack_308;
  undefined4 uStack_304;
  uint *local_300;
  undefined8 local_2f8;
  uint local_2f0 [2];
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8 [8];
  undefined8 uStack_2c0;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  uint *local_278;
  undefined8 local_270;
  uint local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined1 local_258;
  undefined1 *local_250;
  undefined8 local_248;
  undefined1 local_240 [8];
  undefined8 uStack_238;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220 [8];
  undefined8 uStack_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [8];
  undefined8 uStack_1f8;
  uint *local_1f0;
  undefined8 local_1e8;
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined1 local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [8];
  undefined8 uStack_190;
  undefined1 *local_188;
  undefined8 local_180;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  uint *local_168;
  undefined8 local_160;
  uint local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130 [8];
  undefined8 uStack_128;
  undefined1 *local_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined8 uStack_108;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0 [8];
  undefined8 uStack_e8;
  uint *local_e0;
  undefined8 local_d8;
  uint local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  long *local_58;
  undefined8 local_50;
  long local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  
  if (command_line_options()::the_options == '\0') {
    iVar2 = __cxa_guard_acquire(&command_line_options()::the_options);
    if (iVar2 != 0) {
      local_988 = &local_978;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"help","");
      local_9a8 = &local_998;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"h","");
      local_9c8 = &local_9b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_9c8,"show this help message","");
      uVar1 = local_858 >> 8;
      local_858 = uVar1 << 8;
      local_828.long_form._M_dataplus._M_p = (pointer)&local_828.long_form.field_2;
      if (local_988 == &local_978) {
        local_828.long_form.field_2._8_8_ = local_978._8_8_;
      }
      else {
        local_828.long_form._M_dataplus._M_p = (pointer)local_988;
      }
      local_828.short_form._M_dataplus._M_p = (pointer)&local_828.short_form.field_2;
      local_828.long_form._M_string_length = local_980;
      local_988 = &local_978;
      local_980 = 0;
      local_978._M_local_buf[0] = '\0';
      if (local_9a8 == &local_998) {
        local_828.short_form.field_2._8_8_ = local_998._8_8_;
      }
      else {
        local_828.short_form._M_dataplus._M_p = (pointer)local_9a8;
      }
      local_828.description._M_dataplus._M_p = (pointer)&local_828.description.field_2;
      local_828.short_form._M_string_length = local_9a0;
      local_9a8 = &local_998;
      local_9a0 = 0;
      local_998._M_local_buf[0] = '\0';
      if (local_9c8 == &local_9b8) {
        local_828.description.field_2._8_8_ = local_9b8._8_8_;
      }
      else {
        local_828.description._M_dataplus._M_p = (pointer)local_9c8;
      }
      local_828.argument._M_dataplus._M_p = (pointer)&local_828.argument.field_2;
      local_828.description._M_string_length = local_9c0;
      local_9c8 = &local_9b8;
      local_9c0 = 0;
      local_9b8._M_local_buf[0] = '\0';
      local_868 = &local_858;
      local_828.argument.field_2._M_allocated_capacity._0_4_ = local_858;
      local_828.argument.field_2._M_allocated_capacity._4_4_ = uStack_854;
      local_828.argument.field_2._8_4_ = uStack_850;
      local_828.argument.field_2._12_4_ = uStack_84c;
      local_828.argument._M_string_length = 0;
      local_860 = 0;
      local_858 = uVar1 << 8;
      local_828.multiple = false;
      local_9e8 = &local_9d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"samples","");
      local_a08 = &local_9f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,"s","");
      local_a28 = &local_a18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a28,"number of samples to collect (default: 100)","");
      local_a48 = &local_a38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,"SAMPLES","");
      local_7a0 = local_790;
      if (local_9e8 == &local_9d8) {
        uStack_788 = uStack_9d0;
        uStack_784 = uStack_9cc;
      }
      else {
        local_7a0 = local_9e8;
      }
      local_780 = local_770;
      local_798 = local_9e0;
      local_9e8 = &local_9d8;
      local_9e0 = 0;
      local_9d8 = local_9d8 & 0xffffff00;
      if (local_a08 == &local_9f8) {
        uStack_768 = uStack_9f0;
        uStack_764 = uStack_9ec;
      }
      else {
        local_780 = local_a08;
      }
      local_760 = local_750;
      local_778 = local_a00;
      local_a08 = &local_9f8;
      local_a00 = 0;
      local_9f8 = local_9f8 & 0xffffff00;
      if (local_a28 == &local_a18) {
        uStack_748 = uStack_a10;
        uStack_744 = uStack_a0c;
      }
      else {
        local_760 = local_a28;
      }
      local_740 = local_730;
      local_758 = local_a20;
      local_a28 = &local_a18;
      local_a20 = 0;
      local_a18 = local_a18 & 0xffffff00;
      if (local_a48 == &local_a38) {
        uStack_728 = uStack_a30;
        uStack_724 = uStack_a2c;
      }
      else {
        local_740 = local_a48;
      }
      local_738 = local_a40;
      local_a48 = &local_a38;
      local_a40 = 0;
      local_a38 = local_a38 & 0xffffff00;
      local_720 = 0;
      local_a68 = &local_a58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a68,"resamples","");
      local_a88 = &local_a78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"rs","");
      local_aa8 = &local_a98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_aa8,"number of resamples for the bootstrap (default: 100000)","");
      local_ac8 = &local_ab8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac8,"RESAMPLES","");
      local_718 = local_708;
      if (local_a68 == &local_a58) {
        uStack_700 = uStack_a50;
        uStack_6fc = uStack_a4c;
      }
      else {
        local_718 = local_a68;
      }
      local_6f8 = local_6e8;
      local_710 = local_a60;
      local_a68 = &local_a58;
      local_a60 = 0;
      local_a58 = local_a58 & 0xffffff00;
      if (local_a88 == &local_a78) {
        uStack_6e0 = uStack_a70;
        uStack_6dc = uStack_a6c;
      }
      else {
        local_6f8 = local_a88;
      }
      local_6d8 = local_6c8;
      local_6f0 = local_a80;
      local_a88 = &local_a78;
      local_a80 = 0;
      local_a78 = local_a78 & 0xffffff00;
      if (local_aa8 == &local_a98) {
        uStack_6c0 = uStack_a90;
        uStack_6bc = uStack_a8c;
      }
      else {
        local_6d8 = local_aa8;
      }
      local_6b8 = local_6a8;
      local_6d0 = local_aa0;
      local_aa8 = &local_a98;
      local_aa0 = 0;
      local_a98 = local_a98 & 0xffffff00;
      if (local_ac8 == &local_ab8) {
        uStack_6a0 = uStack_ab0;
        uStack_69c = uStack_aac;
      }
      else {
        local_6b8 = local_ac8;
      }
      local_6b0 = local_ac0;
      local_ac8 = &local_ab8;
      local_ac0 = 0;
      local_ab8 = local_ab8 & 0xffffff00;
      local_698 = 0;
      local_ae8 = &local_ad8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ae8,"confidence-interval","")
      ;
      local_b08 = &local_af8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b08,"ci","");
      local_b28 = &local_b18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b28,
                 "confidence interval for the bootstrap (between 0 and 1, default: 0.95)","");
      local_b48 = &local_b38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"INTERVAL","");
      local_690 = local_680;
      if (local_ae8 == &local_ad8) {
        uStack_678 = uStack_ad0;
        uStack_674 = uStack_acc;
      }
      else {
        local_690 = local_ae8;
      }
      local_670 = local_660;
      local_688 = local_ae0;
      local_ae8 = &local_ad8;
      local_ae0 = 0;
      local_ad8 = local_ad8 & 0xffffff00;
      if (local_b08 == &local_af8) {
        uStack_658 = uStack_af0;
        uStack_654 = uStack_aec;
      }
      else {
        local_670 = local_b08;
      }
      local_650 = local_640;
      local_668 = local_b00;
      local_b08 = &local_af8;
      local_b00 = 0;
      local_af8 = local_af8 & 0xffffff00;
      if (local_b28 == &local_b18) {
        uStack_638 = uStack_b10;
        uStack_634 = uStack_b0c;
      }
      else {
        local_650 = local_b28;
      }
      local_630 = local_620;
      local_648 = local_b20;
      local_b28 = &local_b18;
      local_b20 = 0;
      local_b18 = local_b18 & 0xffffff00;
      if (local_b48 == &local_b38) {
        uStack_618 = uStack_b30;
        uStack_614 = uStack_b2c;
      }
      else {
        local_630 = local_b48;
      }
      local_628 = local_b40;
      local_b48 = &local_b38;
      local_b40 = 0;
      local_b38 = local_b38 & 0xffffff00;
      local_610 = 0;
      local_b68 = &local_b58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b68,"param","");
      local_b88 = &local_b78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b88,"p","");
      local_ba8 = &local_b98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ba8,"set a benchmark parameter","");
      local_bc8 = &local_bb8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc8,"PARAM","");
      local_608 = local_5f8;
      if (local_b68 == &local_b58) {
        uStack_5f0 = uStack_b50;
        uStack_5ec = uStack_b4c;
      }
      else {
        local_608 = local_b68;
      }
      local_5e8 = local_5d8;
      local_600 = local_b60;
      local_b68 = &local_b58;
      local_b60 = 0;
      local_b58 = local_b58 & 0xffffff00;
      if (local_b88 == &local_b78) {
        uStack_5d0 = uStack_b70;
        uStack_5cc = uStack_b6c;
      }
      else {
        local_5e8 = local_b88;
      }
      local_5c8 = local_5b8;
      local_5e0 = local_b80;
      local_b88 = &local_b78;
      local_b80 = 0;
      local_b78 = local_b78 & 0xffffff00;
      if (local_ba8 == &local_b98) {
        uStack_5b0 = uStack_b90;
        uStack_5ac = uStack_b8c;
      }
      else {
        local_5c8 = local_ba8;
      }
      local_5a8 = local_598;
      local_5c0 = local_ba0;
      local_ba8 = &local_b98;
      local_ba0 = 0;
      local_b98 = local_b98 & 0xffffff00;
      if (local_bc8 == &local_bb8) {
        uStack_590 = uStack_bb0;
        uStack_58c = uStack_bac;
      }
      else {
        local_5a8 = local_bc8;
      }
      local_5a0 = local_bc0;
      local_bc8 = &local_bb8;
      local_bc0 = 0;
      local_bb8 = local_bb8 & 0xffffff00;
      local_588 = 0;
      local_be8 = &local_bd8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_be8,"output","");
      local_c08 = &local_bf8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c08,"o","");
      local_c28 = &local_c18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c28,"output file (default: <stdout>)","");
      local_c48 = &local_c38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c48,"FILE","");
      local_580 = local_570;
      if (local_be8 == &local_bd8) {
        uStack_568 = uStack_bd0;
        uStack_564 = uStack_bcc;
      }
      else {
        local_580 = local_be8;
      }
      local_560 = local_550;
      local_578 = local_be0;
      local_be8 = &local_bd8;
      local_be0 = 0;
      local_bd8 = local_bd8 & 0xffffff00;
      if (local_c08 == &local_bf8) {
        uStack_548 = uStack_bf0;
        uStack_544 = uStack_bec;
      }
      else {
        local_560 = local_c08;
      }
      local_540 = local_530;
      local_558 = local_c00;
      local_c08 = &local_bf8;
      local_c00 = 0;
      local_bf8 = local_bf8 & 0xffffff00;
      if (local_c28 == &local_c18) {
        uStack_528 = uStack_c10;
        uStack_524 = uStack_c0c;
      }
      else {
        local_540 = local_c28;
      }
      local_520 = local_510;
      local_538 = local_c20;
      local_c28 = &local_c18;
      local_c20 = 0;
      local_c18 = local_c18 & 0xffffff00;
      if (local_c48 == &local_c38) {
        uStack_508 = uStack_c30;
        uStack_504 = uStack_c2c;
      }
      else {
        local_520 = local_c48;
      }
      local_518 = local_c40;
      local_c48 = &local_c38;
      local_c40 = 0;
      local_c38 = local_c38 & 0xffffff00;
      local_500 = 0;
      local_c68 = &local_c58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c68,"reporter","");
      local_c88 = &local_c78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c88,"r","");
      local_ca8 = &local_c98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ca8,"reporter to use (default: standard)","");
      local_cc8 = &local_cb8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"REPORTER","");
      local_4f8 = local_4e8;
      if (local_c68 == &local_c58) {
        uStack_4e0 = uStack_c50;
        uStack_4dc = uStack_c4c;
      }
      else {
        local_4f8 = local_c68;
      }
      local_4d8 = local_4c8;
      local_4f0 = local_c60;
      local_c68 = &local_c58;
      local_c60 = 0;
      local_c58 = local_c58 & 0xffffff00;
      if (local_c88 == &local_c78) {
        uStack_4c0 = uStack_c70;
        uStack_4bc = uStack_c6c;
      }
      else {
        local_4d8 = local_c88;
      }
      local_4b8 = local_4a8;
      local_4d0 = local_c80;
      local_c88 = &local_c78;
      local_c80 = 0;
      local_c78 = local_c78 & 0xffffff00;
      if (local_ca8 == &local_c98) {
        uStack_4a0 = uStack_c90;
        uStack_49c = uStack_c8c;
      }
      else {
        local_4b8 = local_ca8;
      }
      local_498 = local_488;
      local_4b0 = local_ca0;
      local_ca8 = &local_c98;
      local_ca0 = 0;
      local_c98 = local_c98 & 0xffffff00;
      if (local_cc8 == &local_cb8) {
        uStack_480 = uStack_cb0;
        uStack_47c = uStack_cac;
      }
      else {
        local_498 = local_cc8;
      }
      local_490 = local_cc0;
      local_cc8 = &local_cb8;
      local_cc0 = 0;
      local_cb8 = local_cb8 & 0xffffff00;
      local_478 = 0;
      local_ce8 = &local_cd8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce8,"title","");
      local_d08 = &local_cf8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d08,"t","");
      local_d28 = &local_d18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d28,"set report title","");
      local_d48 = &local_d38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d48,"TITLE","");
      local_470 = local_460;
      if (local_ce8 == &local_cd8) {
        uStack_458 = uStack_cd0;
        uStack_454 = uStack_ccc;
      }
      else {
        local_470 = local_ce8;
      }
      local_450 = local_440;
      local_468 = local_ce0;
      local_ce8 = &local_cd8;
      local_ce0 = 0;
      local_cd8 = local_cd8 & 0xffffff00;
      if (local_d08 == &local_cf8) {
        uStack_438 = uStack_cf0;
        uStack_434 = uStack_cec;
      }
      else {
        local_450 = local_d08;
      }
      local_430 = local_420;
      local_448 = local_d00;
      local_d08 = &local_cf8;
      local_d00 = 0;
      local_cf8 = local_cf8 & 0xffffff00;
      if (local_d28 == &local_d18) {
        uStack_418 = uStack_d10;
        uStack_414 = uStack_d0c;
      }
      else {
        local_430 = local_d28;
      }
      local_410 = local_400;
      local_428 = local_d20;
      local_d28 = &local_d18;
      local_d20 = 0;
      local_d18 = local_d18 & 0xffffff00;
      if (local_d48 == &local_d38) {
        uStack_3f8 = uStack_d30;
        uStack_3f4 = uStack_d2c;
      }
      else {
        local_410 = local_d48;
      }
      local_408 = local_d40;
      local_d48 = &local_d38;
      local_d40 = 0;
      local_d38 = local_d38 & 0xffffff00;
      local_3f0 = 0;
      local_d68 = &local_d58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d68,"no-analysis","");
      local_d88 = &local_d78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d88,"A","");
      local_da8 = &local_d98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_da8,"perform only measurements; do not perform any analysis","");
      uVar1 = local_878 >> 8;
      local_878 = uVar1 << 8;
      local_3e8 = local_3d8;
      if (local_d68 == &local_d58) {
        uStack_3d0 = uStack_d50;
      }
      else {
        local_3e8 = local_d68;
      }
      local_3c8 = local_3b8;
      local_3e0 = local_d60;
      local_d68 = &local_d58;
      local_d60 = 0;
      local_d58 = 0;
      if (local_d88 == &local_d78) {
        uStack_3b0 = uStack_d70;
      }
      else {
        local_3c8 = local_d88;
      }
      local_3a8 = local_398;
      local_3c0 = local_d80;
      local_d88 = &local_d78;
      local_d80 = 0;
      local_d78 = 0;
      if (local_da8 == &local_d98) {
        uStack_390 = uStack_d90;
      }
      else {
        local_3a8 = local_da8;
      }
      local_388 = &local_378;
      local_3a0 = local_da0;
      local_da8 = &local_d98;
      local_da0 = 0;
      local_d98 = 0;
      local_888 = &local_878;
      local_378 = local_878;
      uStack_374 = uStack_874;
      uStack_370 = uStack_870;
      uStack_36c = uStack_86c;
      local_380 = 0;
      local_880 = 0;
      local_878 = uVar1 << 8;
      local_368 = 0;
      local_dc8 = &local_db8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_dc8,"filter","");
      local_de8 = &local_dd8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_de8,"f","");
      local_e08 = &local_df8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e08,
                 "only run benchmarks whose name matches the regular expression pattern","");
      local_e28 = &local_e18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e28,"PATTERN","");
      local_360 = local_350;
      if (local_dc8 == &local_db8) {
        uStack_348 = uStack_db0;
        uStack_344 = uStack_dac;
      }
      else {
        local_360 = local_dc8;
      }
      local_340 = local_330;
      local_358 = local_dc0;
      local_dc8 = &local_db8;
      local_dc0 = 0;
      local_db8 = local_db8 & 0xffffff00;
      if (local_de8 == &local_dd8) {
        uStack_328 = uStack_dd0;
        uStack_324 = uStack_dcc;
      }
      else {
        local_340 = local_de8;
      }
      local_320 = local_310;
      local_338 = local_de0;
      local_de8 = &local_dd8;
      local_de0 = 0;
      local_dd8 = local_dd8 & 0xffffff00;
      if (local_e08 == &local_df8) {
        uStack_308 = uStack_df0;
        uStack_304 = uStack_dec;
      }
      else {
        local_320 = local_e08;
      }
      local_300 = local_2f0;
      local_318 = local_e00;
      local_e08 = &local_df8;
      local_e00 = 0;
      local_df8 = local_df8 & 0xffffff00;
      if (local_e28 == &local_e18) {
        uStack_2e8 = uStack_e10;
        uStack_2e4 = uStack_e0c;
      }
      else {
        local_300 = local_e28;
      }
      local_2f8 = local_e20;
      local_e28 = &local_e18;
      local_e20 = 0;
      local_e18 = local_e18 & 0xffffff00;
      local_2e0 = 0;
      local_e48 = &local_e38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e48,"list","");
      local_e68 = &local_e58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e68,"l","");
      local_e88 = &local_e78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e88,"list benchmarks","");
      uVar1 = local_898 >> 8;
      local_898 = uVar1 << 8;
      local_2d8 = local_2c8;
      if (local_e48 == &local_e38) {
        uStack_2c0 = uStack_e30;
      }
      else {
        local_2d8 = local_e48;
      }
      local_2b8 = local_2a8;
      local_2d0 = local_e40;
      local_e48 = &local_e38;
      local_e40 = 0;
      local_e38 = 0;
      if (local_e68 == &local_e58) {
        uStack_2a0 = uStack_e50;
      }
      else {
        local_2b8 = local_e68;
      }
      local_298 = local_288;
      local_2b0 = local_e60;
      local_e68 = &local_e58;
      local_e60 = 0;
      local_e58 = 0;
      if (local_e88 == &local_e78) {
        uStack_280 = uStack_e70;
      }
      else {
        local_298 = local_e88;
      }
      local_278 = &local_268;
      local_290 = local_e80;
      local_e88 = &local_e78;
      local_e80 = 0;
      local_e78 = 0;
      local_8a8 = &local_898;
      local_268 = local_898;
      uStack_264 = uStack_894;
      uStack_260 = uStack_890;
      uStack_25c = uStack_88c;
      local_270 = 0;
      local_8a0 = 0;
      local_898 = uVar1 << 8;
      local_258 = 0;
      local_ea8 = &local_e98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ea8,"list-params","");
      local_ec8 = &local_eb8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ec8,"lp","");
      local_ee8 = &local_ed8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ee8,"list available parameters","");
      uVar1 = local_8b8 >> 8;
      local_8b8 = uVar1 << 8;
      local_250 = local_240;
      if (local_ea8 == &local_e98) {
        uStack_238 = uStack_e90;
      }
      else {
        local_250 = local_ea8;
      }
      local_230 = local_220;
      local_248 = local_ea0;
      local_ea8 = &local_e98;
      local_ea0 = 0;
      local_e98 = 0;
      if (local_ec8 == &local_eb8) {
        uStack_218 = uStack_eb0;
      }
      else {
        local_230 = local_ec8;
      }
      local_210 = local_200;
      local_228 = local_ec0;
      local_ec8 = &local_eb8;
      local_ec0 = 0;
      local_eb8 = 0;
      if (local_ee8 == &local_ed8) {
        uStack_1f8 = uStack_ed0;
      }
      else {
        local_210 = local_ee8;
      }
      local_1f0 = &local_1e0;
      local_208 = local_ee0;
      local_ee8 = &local_ed8;
      local_ee0 = 0;
      local_ed8 = 0;
      local_8c8 = &local_8b8;
      local_1e0 = local_8b8;
      uStack_1dc = uStack_8b4;
      uStack_1d8 = uStack_8b0;
      uStack_1d4 = uStack_8ac;
      local_1e8 = 0;
      local_8c0 = 0;
      local_8b8 = uVar1 << 8;
      local_1d0 = 0;
      local_f08 = &local_ef8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f08,"list-reporters","");
      local_f28 = &local_f18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f28,"lr","");
      local_f48 = &local_f38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f48,"list available reporters","");
      uVar1 = local_8d8 >> 8;
      local_8d8 = uVar1 << 8;
      local_1c8 = local_1b8;
      if (local_f08 == &local_ef8) {
        uStack_1b0 = uStack_ef0;
      }
      else {
        local_1c8 = local_f08;
      }
      local_1a8 = local_198;
      local_1c0 = local_f00;
      local_f08 = &local_ef8;
      local_f00 = 0;
      local_ef8 = 0;
      if (local_f28 == &local_f18) {
        uStack_190 = uStack_f10;
      }
      else {
        local_1a8 = local_f28;
      }
      local_188 = local_178;
      local_1a0 = local_f20;
      local_f28 = &local_f18;
      local_f20 = 0;
      local_f18 = 0;
      if (local_f48 == &local_f38) {
        uStack_170 = uStack_f30;
      }
      else {
        local_188 = local_f48;
      }
      local_168 = &local_158;
      local_180 = local_f40;
      local_f48 = &local_f38;
      local_f40 = 0;
      local_f38 = 0;
      local_8e8 = &local_8d8;
      local_158 = local_8d8;
      uStack_154 = uStack_8d4;
      uStack_150 = uStack_8d0;
      uStack_14c = uStack_8cc;
      local_160 = 0;
      local_8e0 = 0;
      local_8d8 = uVar1 << 8;
      local_148 = 0;
      local_f68 = &local_f58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f68,"verbose","");
      local_f88 = &local_f78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f88,"v","");
      local_fa8 = &local_f98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_fa8,"show verbose output (mutually exclusive with -q)","");
      uVar1 = local_8f8 >> 8;
      local_8f8 = uVar1 << 8;
      local_140 = local_130;
      if (local_f68 == &local_f58) {
        uStack_128 = uStack_f50;
      }
      else {
        local_140 = local_f68;
      }
      local_120 = local_110;
      local_138 = local_f60;
      local_f68 = &local_f58;
      local_f60 = 0;
      local_f58 = 0;
      if (local_f88 == &local_f78) {
        uStack_108 = uStack_f70;
      }
      else {
        local_120 = local_f88;
      }
      local_100 = local_f0;
      local_118 = local_f80;
      local_f88 = &local_f78;
      local_f80 = 0;
      local_f78 = 0;
      if (local_fa8 == &local_f98) {
        uStack_e8 = uStack_f90;
      }
      else {
        local_100 = local_fa8;
      }
      local_e0 = &local_d0;
      local_f8 = local_fa0;
      local_fa8 = &local_f98;
      local_fa0 = 0;
      local_f98 = 0;
      local_908 = &local_8f8;
      local_d0 = local_8f8;
      uStack_cc = uStack_8f4;
      uStack_c8 = uStack_8f0;
      uStack_c4 = uStack_8ec;
      local_d8 = 0;
      local_900 = 0;
      local_8f8 = uVar1 << 8;
      local_c0 = 0;
      local_928 = &local_918;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"summary","");
      local_948 = &local_938;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_948,"q","");
      local_968 = &local_958;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_968,"show summary output (mutually exclusive with -v)","");
      local_b8 = local_a8;
      if (local_928 == &local_918) {
        uStack_a0 = uStack_910;
      }
      else {
        local_b8 = local_928;
      }
      local_98 = local_88;
      local_b0 = local_920;
      local_920 = 0;
      local_918 = 0;
      if (local_948 == &local_938) {
        uStack_80 = uStack_930;
      }
      else {
        local_98 = local_948;
      }
      local_78 = local_68;
      local_90 = local_940;
      local_940 = 0;
      local_938 = 0;
      if (local_968 == &local_958) {
        uStack_60 = uStack_950;
      }
      else {
        local_78 = local_968;
      }
      local_58 = &local_48;
      local_70 = local_960;
      local_960 = 0;
      local_958 = 0;
      local_48 = (ulong)uStack_837 << 8;
      uStack_40 = uStack_830;
      local_50 = 0;
      local_840 = 0;
      local_838 = 0;
      local_38 = 0;
      __l._M_len = 0xf;
      __l._M_array = &local_828;
      local_968 = &local_958;
      local_948 = &local_938;
      local_928 = &local_918;
      local_848 = &local_838;
      std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::vector
                (&command_line_options::the_options,__l,&local_fa9);
      lVar3 = 0x770;
      do {
        option::~option((option *)((long)&local_828.long_form._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0x88;
      } while (lVar3 != -0x88);
      if (local_848 != &local_838) {
        operator_delete(local_848,CONCAT71(uStack_837,local_838) + 1);
      }
      if (local_968 != &local_958) {
        operator_delete(local_968,CONCAT71(uStack_957,local_958) + 1);
      }
      if (local_948 != &local_938) {
        operator_delete(local_948,CONCAT71(uStack_937,local_938) + 1);
      }
      if (local_928 != &local_918) {
        operator_delete(local_928,CONCAT71(uStack_917,local_918) + 1);
      }
      if (local_908 != &local_8f8) {
        operator_delete(local_908,CONCAT44(uStack_8f4,local_8f8) + 1);
      }
      if (local_fa8 != &local_f98) {
        operator_delete(local_fa8,CONCAT71(uStack_f97,local_f98) + 1);
      }
      if (local_f88 != &local_f78) {
        operator_delete(local_f88,CONCAT71(uStack_f77,local_f78) + 1);
      }
      if (local_f68 != &local_f58) {
        operator_delete(local_f68,CONCAT71(uStack_f57,local_f58) + 1);
      }
      if (local_8e8 != &local_8d8) {
        operator_delete(local_8e8,CONCAT44(uStack_8d4,local_8d8) + 1);
      }
      if (local_f48 != &local_f38) {
        operator_delete(local_f48,CONCAT71(uStack_f37,local_f38) + 1);
      }
      if (local_f28 != &local_f18) {
        operator_delete(local_f28,CONCAT71(uStack_f17,local_f18) + 1);
      }
      if (local_f08 != &local_ef8) {
        operator_delete(local_f08,CONCAT71(uStack_ef7,local_ef8) + 1);
      }
      if (local_8c8 != &local_8b8) {
        operator_delete(local_8c8,CONCAT44(uStack_8b4,local_8b8) + 1);
      }
      if (local_ee8 != &local_ed8) {
        operator_delete(local_ee8,CONCAT71(uStack_ed7,local_ed8) + 1);
      }
      if (local_ec8 != &local_eb8) {
        operator_delete(local_ec8,CONCAT71(uStack_eb7,local_eb8) + 1);
      }
      if (local_ea8 != &local_e98) {
        operator_delete(local_ea8,CONCAT71(uStack_e97,local_e98) + 1);
      }
      if (local_8a8 != &local_898) {
        operator_delete(local_8a8,CONCAT44(uStack_894,local_898) + 1);
      }
      if (local_e88 != &local_e78) {
        operator_delete(local_e88,CONCAT71(uStack_e77,local_e78) + 1);
      }
      if (local_e68 != &local_e58) {
        operator_delete(local_e68,CONCAT71(uStack_e57,local_e58) + 1);
      }
      if (local_e48 != &local_e38) {
        operator_delete(local_e48,CONCAT71(uStack_e37,local_e38) + 1);
      }
      if (local_e28 != &local_e18) {
        operator_delete(local_e28,CONCAT44(uStack_e14,local_e18) + 1);
      }
      if (local_e08 != &local_df8) {
        operator_delete(local_e08,CONCAT44(uStack_df4,local_df8) + 1);
      }
      if (local_de8 != &local_dd8) {
        operator_delete(local_de8,CONCAT44(uStack_dd4,local_dd8) + 1);
      }
      if (local_dc8 != &local_db8) {
        operator_delete(local_dc8,CONCAT44(uStack_db4,local_db8) + 1);
      }
      if (local_888 != &local_878) {
        operator_delete(local_888,CONCAT44(uStack_874,local_878) + 1);
      }
      if (local_da8 != &local_d98) {
        operator_delete(local_da8,CONCAT71(uStack_d97,local_d98) + 1);
      }
      if (local_d88 != &local_d78) {
        operator_delete(local_d88,CONCAT71(uStack_d77,local_d78) + 1);
      }
      if (local_d68 != &local_d58) {
        operator_delete(local_d68,CONCAT71(uStack_d57,local_d58) + 1);
      }
      if (local_d48 != &local_d38) {
        operator_delete(local_d48,CONCAT44(uStack_d34,local_d38) + 1);
      }
      if (local_d28 != &local_d18) {
        operator_delete(local_d28,CONCAT44(uStack_d14,local_d18) + 1);
      }
      if (local_d08 != &local_cf8) {
        operator_delete(local_d08,CONCAT44(uStack_cf4,local_cf8) + 1);
      }
      if (local_ce8 != &local_cd8) {
        operator_delete(local_ce8,CONCAT44(uStack_cd4,local_cd8) + 1);
      }
      if (local_cc8 != &local_cb8) {
        operator_delete(local_cc8,CONCAT44(uStack_cb4,local_cb8) + 1);
      }
      if (local_ca8 != &local_c98) {
        operator_delete(local_ca8,CONCAT44(uStack_c94,local_c98) + 1);
      }
      if (local_c88 != &local_c78) {
        operator_delete(local_c88,CONCAT44(uStack_c74,local_c78) + 1);
      }
      if (local_c68 != &local_c58) {
        operator_delete(local_c68,CONCAT44(uStack_c54,local_c58) + 1);
      }
      if (local_c48 != &local_c38) {
        operator_delete(local_c48,CONCAT44(uStack_c34,local_c38) + 1);
      }
      if (local_c28 != &local_c18) {
        operator_delete(local_c28,CONCAT44(uStack_c14,local_c18) + 1);
      }
      if (local_c08 != &local_bf8) {
        operator_delete(local_c08,CONCAT44(uStack_bf4,local_bf8) + 1);
      }
      if (local_be8 != &local_bd8) {
        operator_delete(local_be8,CONCAT44(uStack_bd4,local_bd8) + 1);
      }
      if (local_bc8 != &local_bb8) {
        operator_delete(local_bc8,CONCAT44(uStack_bb4,local_bb8) + 1);
      }
      if (local_ba8 != &local_b98) {
        operator_delete(local_ba8,CONCAT44(uStack_b94,local_b98) + 1);
      }
      if (local_b88 != &local_b78) {
        operator_delete(local_b88,CONCAT44(uStack_b74,local_b78) + 1);
      }
      if (local_b68 != &local_b58) {
        operator_delete(local_b68,CONCAT44(uStack_b54,local_b58) + 1);
      }
      if (local_b48 != &local_b38) {
        operator_delete(local_b48,CONCAT44(uStack_b34,local_b38) + 1);
      }
      if (local_b28 != &local_b18) {
        operator_delete(local_b28,CONCAT44(uStack_b14,local_b18) + 1);
      }
      if (local_b08 != &local_af8) {
        operator_delete(local_b08,CONCAT44(uStack_af4,local_af8) + 1);
      }
      if (local_ae8 != &local_ad8) {
        operator_delete(local_ae8,CONCAT44(uStack_ad4,local_ad8) + 1);
      }
      if (local_ac8 != &local_ab8) {
        operator_delete(local_ac8,CONCAT44(uStack_ab4,local_ab8) + 1);
      }
      if (local_aa8 != &local_a98) {
        operator_delete(local_aa8,CONCAT44(uStack_a94,local_a98) + 1);
      }
      if (local_a88 != &local_a78) {
        operator_delete(local_a88,CONCAT44(uStack_a74,local_a78) + 1);
      }
      if (local_a68 != &local_a58) {
        operator_delete(local_a68,CONCAT44(uStack_a54,local_a58) + 1);
      }
      if (local_a48 != &local_a38) {
        operator_delete(local_a48,CONCAT44(uStack_a34,local_a38) + 1);
      }
      if (local_a28 != &local_a18) {
        operator_delete(local_a28,CONCAT44(uStack_a14,local_a18) + 1);
      }
      if (local_a08 != &local_9f8) {
        operator_delete(local_a08,CONCAT44(uStack_9f4,local_9f8) + 1);
      }
      if (local_9e8 != &local_9d8) {
        operator_delete(local_9e8,CONCAT44(uStack_9d4,local_9d8) + 1);
      }
      if (local_868 != &local_858) {
        operator_delete(local_868,CONCAT44(uStack_854,local_858) + 1);
      }
      if (local_9c8 != &local_9b8) {
        operator_delete(local_9c8,
                        CONCAT71(local_9b8._M_allocated_capacity._1_7_,local_9b8._M_local_buf[0]) +
                        1);
      }
      if (local_9a8 != &local_998) {
        operator_delete(local_9a8,
                        CONCAT71(local_998._M_allocated_capacity._1_7_,local_998._M_local_buf[0]) +
                        1);
      }
      if (local_988 != &local_978) {
        operator_delete(local_988,
                        CONCAT71(local_978._M_allocated_capacity._1_7_,local_978._M_local_buf[0]) +
                        1);
      }
      __cxa_atexit(std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::
                   ~vector,&command_line_options::the_options,&__dso_handle);
      __cxa_guard_release(&command_line_options()::the_options);
    }
  }
  return &command_line_options::the_options;
}

Assistant:

inline detail::option_set const& command_line_options() {
            static detail::option_set the_options {
                detail::option("help", "h", "show this help message"),
                detail::option("samples", "s", "number of samples to collect (default: 100)", "SAMPLES"),
                detail::option("resamples", "rs", "number of resamples for the bootstrap (default: 100000)", "RESAMPLES"),
                detail::option("confidence-interval", "ci", "confidence interval for the bootstrap (between 0 and 1, default: 0.95)", "INTERVAL"),
                detail::option("param", "p", "set a benchmark parameter", "PARAM"),
                detail::option("output", "o", "output file (default: <stdout>)", "FILE"),
                detail::option("reporter", "r", "reporter to use (default: standard)", "REPORTER"),
                detail::option("title", "t", "set report title", "TITLE"),
                detail::option("no-analysis", "A", "perform only measurements; do not perform any analysis"),
                detail::option("filter", "f", "only run benchmarks whose name matches the regular expression pattern", "PATTERN"),
                detail::option("list", "l", "list benchmarks"),
                detail::option("list-params", "lp", "list available parameters"),
                detail::option("list-reporters", "lr", "list available reporters"),
                detail::option("verbose", "v", "show verbose output (mutually exclusive with -q)"),
                detail::option("summary", "q", "show summary output (mutually exclusive with -v)")
            };
            return the_options;
        }